

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram_enc.c
# Opt level: O0

uint64_t GetCombinedEntropy(uint32_t *X,uint32_t *Y,int length,int is_X_used,int is_Y_used,
                           int trivial_at_end)

{
  VP8LStreaks *stats_00;
  int in_ECX;
  int in_EDX;
  uint32_t *in_RSI;
  uint32_t *in_RDI;
  int in_R8D;
  int in_R9D;
  VP8LBitEntropy bit_entropy;
  VP8LStreaks stats;
  VP8LStreaks *in_stack_ffffffffffffffa0;
  VP8LBitEntropy *in_stack_ffffffffffffffa8;
  VP8LStreaks local_40;
  int local_1c;
  uint64_t local_8;
  
  local_1c = in_EDX;
  if (in_R9D == 0) {
    if (in_ECX == 0) {
      if (in_R8D == 0) {
        memset(&local_40,0,0x18);
        local_40.counts[0] = 1;
        local_40.streaks[0][(int)(uint)(3 < local_1c)] = local_1c;
        VP8LBitEntropyInit((VP8LBitEntropy *)&stack0xffffffffffffffa8);
      }
      else {
        (*VP8LGetEntropyUnrefined)
                  (in_RSI,in_EDX,(VP8LBitEntropy *)&stack0xffffffffffffffa8,&local_40);
      }
    }
    else if (in_R8D == 0) {
      (*VP8LGetEntropyUnrefined)(in_RDI,in_EDX,(VP8LBitEntropy *)&stack0xffffffffffffffa8,&local_40)
      ;
    }
    else {
      (*VP8LGetCombinedEntropyUnrefined)
                (in_RDI,in_RSI,in_EDX,(VP8LBitEntropy *)&stack0xffffffffffffffa8,&local_40);
    }
    stats_00 = (VP8LStreaks *)BitsEntropyRefine(in_stack_ffffffffffffffa8);
    local_8 = FinalHuffmanCost(stats_00);
    local_8 = (long)stats_00->counts + local_8;
  }
  else {
    memset(&local_40,0,0x18);
    local_40.streaks[1][0] = 1;
    local_40.counts[0] = 1;
    local_40.streaks[0][1] = local_1c + -1;
    local_8 = FinalHuffmanCost(in_stack_ffffffffffffffa0);
  }
  return local_8;
}

Assistant:

static WEBP_INLINE uint64_t GetCombinedEntropy(const uint32_t* const X,
                                               const uint32_t* const Y,
                                               int length, int is_X_used,
                                               int is_Y_used,
                                               int trivial_at_end) {
  VP8LStreaks stats;
  if (trivial_at_end) {
    // This configuration is due to palettization that transforms an indexed
    // pixel into 0xff000000 | (pixel << 8) in VP8LBundleColorMap.
    // BitsEntropyRefine is 0 for histograms with only one non-zero value.
    // Only FinalHuffmanCost needs to be evaluated.
    memset(&stats, 0, sizeof(stats));
    // Deal with the non-zero value at index 0 or length-1.
    stats.streaks[1][0] = 1;
    // Deal with the following/previous zero streak.
    stats.counts[0] = 1;
    stats.streaks[0][1] = length - 1;
    return FinalHuffmanCost(&stats);
  } else {
    VP8LBitEntropy bit_entropy;
    if (is_X_used) {
      if (is_Y_used) {
        VP8LGetCombinedEntropyUnrefined(X, Y, length, &bit_entropy, &stats);
      } else {
        VP8LGetEntropyUnrefined(X, length, &bit_entropy, &stats);
      }
    } else {
      if (is_Y_used) {
        VP8LGetEntropyUnrefined(Y, length, &bit_entropy, &stats);
      } else {
        memset(&stats, 0, sizeof(stats));
        stats.counts[0] = 1;
        stats.streaks[0][length > 3] = length;
        VP8LBitEntropyInit(&bit_entropy);
      }
    }

    return BitsEntropyRefine(&bit_entropy) + FinalHuffmanCost(&stats);
  }
}